

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O0

WJTL_STATUS TestDictionaries(_Bool IsJson5)

{
  WJTL_STATUS WVar1;
  int iVar2;
  _Bool _result_48;
  _Bool _result_47;
  _Bool _result_46;
  _Bool _result_45;
  _Bool _result_44;
  _Bool _result_43;
  _Bool _result_42;
  _Bool _result_41;
  _Bool _result_40;
  _Bool _result_39;
  _Bool _result_38;
  _Bool _result_37;
  _Bool _result_36;
  _Bool _result_35;
  _Bool _result_34;
  _Bool _result_33;
  _Bool _result_32;
  _Bool _result_31;
  _Bool _result_30;
  _Bool _result_29;
  _Bool _result_28;
  _Bool _result_27;
  _Bool _result_26;
  _Bool _result_25;
  _Bool _result_24;
  _Bool _result_23;
  _Bool _result_22;
  _Bool _result_21;
  _Bool _result_20;
  _Bool _result_19;
  _Bool _result_18;
  _Bool _result_17;
  _Bool _result_16;
  _Bool _result_15;
  _Bool _result_14;
  _Bool _result_13;
  _Bool _result_12;
  _Bool _result_11;
  _Bool _result_10;
  _Bool _result_9;
  _Bool _result_8;
  _Bool _result_7;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  _Bool _result;
  WJTL_STATUS TestReturn;
  _Bool IsJson5_local;
  
  __result_7 = WJTL_STATUS_SUCCESS;
  WVar1 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5,"{\"item1\":1,\"item2\":2,\"item3\":3 }",3);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{\\\"item1\\\":1,\\\"item2\\\":2,\\\"item3\\\":3 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d0);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5,"{\"item3\":3,\"item2\":2,\"item1\":1 }",3);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{\\\"item3\\\":3,\\\"item2\\\":2,\\\"item1\\\":1 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d1);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5," { \"item1\" : 1, \"item2\" : 2 }",2);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \\\"item1\\\" : 1, \\\"item2\\\" : 2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d2);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5," { }",0);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { }\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d3);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonParsesAsDictionaryOfStrings
                    (IsJson5,"{\"item1\":\"1\",\"item2\":\"2\",\"item3\":\"3\" }",3);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \"{\\\"item1\\\":\\\"1\\\",\\\"item2\\\":\\\"2\\\",\\\"item3\\\":\\\"3\\\" }\", 3 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d6);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonParsesAsDictionaryOfStrings
                    (IsJson5,"{\"item3\":\"3\",\"item2\":\"2\",\"item1\":\"1\" }",3);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \"{\\\"item3\\\":\\\"3\\\",\\\"item2\\\":\\\"2\\\",\\\"item1\\\":\\\"1\\\" }\", 3 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d7);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonParsesAsDictionaryOfStrings
                    (IsJson5," { \"item1\" : \"1\", \"item2\" : \"2\" }",2);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \" { \\\"item1\\\" : \\\"1\\\", \\\"item2\\\" : \\\"2\\\" }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d8);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonParsesAsDictionaryOfStrings(IsJson5," { }",0);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \" { }\", 0 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3d9);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonParsesAsDictionaryOfNumbers
                    (IsJson5,
                     " { \"dummy1\":\"String\", \"item1\" : 1, \"dummy2\":12345, \"item2\" : 2 }",2)
  ;
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \\\"dummy1\\\":\\\"String\\\", \\\"item1\\\" : 1, \\\"dummy2\\\":12345, \\\"item2\\\" : 2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3dc);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonParsesAsDictionaryOfNumbers
                    (IsJson5,
                     " { \"dummy1\":{\"sub1\":true,\"sub2\":[{\"aa\":\"bb\"}, 1,2,3,4,5]}, \"item1\":1,  \"item2\":2 }"
                     ,2);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \\\"dummy1\\\":{\\\"sub1\\\":true,\\\"sub2\\\":[{\\\"aa\\\":\\\"bb\\\"}, 1,2,3,4,5]}, \\\"item1\\\":1,  \\\"item2\\\":2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x3dd);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  if (IsJson5) {
    WVar1 = VerifyJsonParsesAsDictionaryOfNumbers
                      (IsJson5,"{\'item1\':1,\'item2\':2,\'item3\':3 }",3);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{\'item1\':1,\'item2\':2,\'item3\':3 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3e2);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfNumbers
                      (IsJson5,"{\'item3\':3,\'item2\':2,\'item1\':1 }",3);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{\'item3\':3,\'item2\':2,\'item1\':1 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3e3);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5," { \'item1\' : 1, \'item2\' : 2 }",2);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \'item1\' : 1, \'item2\' : 2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3e4);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5," { }",0);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { }\", 0 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3e5);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfStrings
                      (IsJson5,"{\'item1\':\'1\',\'item2\':\'2\',\'item3\':\'3\' }",3);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \"{\'item1\':\'1\',\'item2\':\'2\',\'item3\':\'3\' }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",1000);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfStrings
                      (IsJson5,"{\'item3\':\'3\',\'item2\':\'2\',\'item1\':\'1\' }",3);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \"{\'item3\':\'3\',\'item2\':\'2\',\'item1\':\'1\' }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3e9);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfStrings
                      (IsJson5," { \'item1\' : \'1\', \'item2\' : \'2\' }",2);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \" { \'item1\' : \'1\', \'item2\' : \'2\' }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3ea);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfStrings(IsJson5," { }",0);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \" { }\", 0 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3eb);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfNumbers
                      (IsJson5,
                       " { \'dummy1\':\'String\', \'item1\' : 1, \'dummy2\':12345, \'item2\' : 2 }",
                       2);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \'dummy1\':\'String\', \'item1\' : 1, \'dummy2\':12345, \'item2\' : 2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3ee);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfNumbers
                      (IsJson5,
                       " { \'dummy1\':{\'sub1\':true,\'sub2\':[{\'aa\':\'bb\'}, 1,2,3,4,5]}, \'item1\':1,  \'item2\':2 }"
                       ,2);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { \'dummy1\':{\'sub1\':true,\'sub2\':[{\'aa\':\'bb\'}, 1,2,3,4,5]}, \'item1\':1,  \'item2\':2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3ef);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5,"{item1:1,item2:2,item3:3 }",3);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{item1:1,item2:2,item3:3 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3f2);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfNumbers
                      (IsJson5,"{item\\u0031:1,it\\u0065m2:2,item3:3 }",3);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{item\\\\u0031:1,it\\\\u0065m2:2,item3:3 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3f3);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5,"{item3:3,item2:2,item1:1 }",3);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{item3:3,item2:2,item1:1 }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3f4);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5," { item1 : 1, item2 : 2 }",2);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { item1 : 1, item2 : 2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3f5);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5," { }",0);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { }\", 0 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3f6);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfStrings
                      (IsJson5,"{item1:\"1\",item2:\"2\",item3:\"3\" }",3);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \"{item1:\\\"1\\\",item2:\\\"2\\\",item3:\\\"3\\\" }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3f9);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfStrings
                      (IsJson5,"{item3:\"3\",item2:\"2\",item1:\"1\" }",3);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \"{item3:\\\"3\\\",item2:\\\"2\\\",item1:\\\"1\\\" }\", 3 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3fa);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfStrings(IsJson5," { item1 : \"1\", item2 : \"2\" }",2);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \" { item1 : \\\"1\\\", item2 : \\\"2\\\" }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3fb);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfStrings(IsJson5," { }",0);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfStrings( IsJson5, \" { }\", 0 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3fc);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfNumbers
                      (IsJson5," { dummy1:\"String\", item1 : 1, dummy2:12345, item2 : 2 }",2);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { dummy1:\\\"String\\\", item1 : 1, dummy2:12345, item2 : 2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x3ff);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfNumbers
                      (IsJson5,
                       " { dummy1:{sub1:true,sub2:[{aa:\"bb\"}, 1,2,3,4,5]}, item1:1,  item2:2 }",2)
    ;
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \" { dummy1:{sub1:true,sub2:[{aa:\\\"bb\\\"}, 1,2,3,4,5]}, item1:1,  item2:2 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x400);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
  }
  if (IsJson5) {
    WVar1 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5,"{\"item1\":1, }",1);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{\\\"item1\\\":1, }\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x406);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonParsesAsDictionaryOfNumbers(IsJson5,"{\"item1\":1 , }",1);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, \"{\\\"item1\\\":1 , }\", 1 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x407);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
  }
  else {
    WVar1 = VerifyJsonUnableToParse(IsJson5,"{\"item1\":1, }",0xc);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{\\\"item1\\\":1, }\", 12 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x40b);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonUnableToParse(IsJson5,"{\"item1\":1 , }",0xd);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{\\\"item1\\\":1 , }\", 13 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x40c);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
  }
  WVar1 = VerifyJsonUnableToParse(IsJson5,"{ \"item1\":1, \"item2\":2,, \"item3\":3 }",0x17);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \\\"item1\\\":1, \\\"item2\\\":2,, \\\"item3\\\":3 }\", 23 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x410);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonUnableToParse(IsJson5,"{ ,\"item1\":1, \"item2\":2, \"item3\":3 }",2);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ ,\\\"item1\\\":1, \\\"item2\\\":2, \\\"item3\\\":3 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x411);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  iVar2 = 2;
  if (IsJson5) {
    iVar2 = 0xb;
  }
  WVar1 = VerifyJsonUnableToParse(IsJson5,"{ BareWord }",(long)iVar2);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ BareWord }\", IsJson5 ? 11 : 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x412);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonUnableToParse(IsJson5,"{ \"string\" }",0xb);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \\\"string\\\" }\", 11 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x413);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  iVar2 = 2;
  if (IsJson5) {
    iVar2 = 0xb;
  }
  WVar1 = VerifyJsonUnableToParse(IsJson5,"{ \'string\' }",(long)iVar2);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \'string\' }\", IsJson5 ? 11 : 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x414);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonUnableToParse(IsJson5,"{ 123 }",2);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ 123 }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x415);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonUnableToParse(IsJson5,"{ [1,2,3] }",2);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ [1,2,3] }\", 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x416);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  iVar2 = 0xd;
  if (IsJson5) {
    iVar2 = 0x12;
  }
  WVar1 = VerifyJsonUnableToParse(IsJson5,"{ \"item1\":1, true }",(long)iVar2);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \\\"item1\\\":1, true }\", IsJson5 ? 18 :13 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x417);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  WVar1 = VerifyJsonUnableToParse(IsJson5,"{ \"item1\":1, \"string\", \"item2\":2 }",0x15);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \\\"item1\\\":1, \\\"string\\\", \\\"item2\\\":2 }\", 21 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x418);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  iVar2 = 2;
  if (IsJson5) {
    iVar2 = 0xb;
  }
  WVar1 = VerifyJsonUnableToParse(IsJson5,"{ \'key\" : \'value\' }",(long)iVar2);
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \'key\\\" : \'value\' }\", IsJson5 ? 11 : 2 ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"TestDictionaries",0x419);
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    __result_7 = WJTL_STATUS_FAILED;
  }
  if (IsJson5) {
    WVar1 = VerifyJsonUnableToParse(IsJson5,"{ bare space: \"value\" }",7);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ bare space: \\\"value\\\" }\", 7 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x41d);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
  }
  else {
    WVar1 = VerifyJsonUnableToParse(IsJson5,"{ \'key\' : \"value\" }",2);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \'key\' : \\\"value\\\" }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x421);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonUnableToParse(IsJson5,"{ \"key\" : \'value\' }",10);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \\\"key\\\" : \'value\' }\", 10 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x422);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
    WVar1 = VerifyJsonUnableToParse(IsJson5,"{ \'key\' : \'value\' }",2);
    WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                     "((JL_STATUS)(VerifyJsonUnableToParse( IsJson5, \"{ \'key\' : \'value\' }\", 2 ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"TestDictionaries",0x423);
    if (WVar1 != WJTL_STATUS_SUCCESS) {
      __result_7 = WJTL_STATUS_FAILED;
    }
  }
  return __result_7;
}

Assistant:

static
WJTL_STATUS
    TestDictionaries
    (
        bool            IsJson5
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    // Test dictionary of numbers
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{\"item1\":1,\"item2\":2,\"item3\":3 }", 3 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{\"item3\":3,\"item2\":2,\"item1\":1 }", 3 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { \"item1\" : 1, \"item2\" : 2 }", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { }", 0 ) );

    // Test dictionary of strings
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, "{\"item1\":\"1\",\"item2\":\"2\",\"item3\":\"3\" }", 3 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, "{\"item3\":\"3\",\"item2\":\"2\",\"item1\":\"1\" }", 3 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, " { \"item1\" : \"1\", \"item2\" : \"2\" }", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, " { }", 0 ) );

    // Test dictionary of numbers that also contains other items we are ignoring (and ensuring get freed)
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { \"dummy1\":\"String\", \"item1\" : 1, \"dummy2\":12345, \"item2\" : 2 }", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { \"dummy1\":{\"sub1\":true,\"sub2\":[{\"aa\":\"bb\"}, 1,2,3,4,5]}, \"item1\":1,  \"item2\":2 }", 2 ) );

    if( IsJson5 )
    {
        // Test Json5 single quoted keys
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{'item1':1,'item2':2,'item3':3 }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{'item3':3,'item2':2,'item1':1 }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { 'item1' : 1, 'item2' : 2 }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { }", 0 ) );

        // Test dictionary of strings
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, "{'item1':'1','item2':'2','item3':'3' }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, "{'item3':'3','item2':'2','item1':'1' }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, " { 'item1' : '1', 'item2' : '2' }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, " { }", 0 ) );

        // Test dictionary of numbers that also contains other items we are ignoring (and ensuring get freed)
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { 'dummy1':'String', 'item1' : 1, 'dummy2':12345, 'item2' : 2 }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { 'dummy1':{'sub1':true,'sub2':[{'aa':'bb'}, 1,2,3,4,5]}, 'item1':1,  'item2':2 }", 2 ) );

        // Test Json5 bareword keys
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{item1:1,item2:2,item3:3 }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{item\\u0031:1,it\\u0065m2:2,item3:3 }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{item3:3,item2:2,item1:1 }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { item1 : 1, item2 : 2 }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { }", 0 ) );

        // Test dictionary of strings
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, "{item1:\"1\",item2:\"2\",item3:\"3\" }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, "{item3:\"3\",item2:\"2\",item1:\"1\" }", 3 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, " { item1 : \"1\", item2 : \"2\" }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfStrings( IsJson5, " { }", 0 ) );

        // Test dictionary of numbers that also contains other items we are ignoring (and ensuring get freed)
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { dummy1:\"String\", item1 : 1, dummy2:12345, item2 : 2 }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, " { dummy1:{sub1:true,sub2:[{aa:\"bb\"}, 1,2,3,4,5]}, item1:1,  item2:2 }", 2 ) );
    }

    // Test trailing commas for Json5
    if( IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{\"item1\":1, }", 1 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsDictionaryOfNumbers( IsJson5, "{\"item1\":1 , }", 1 ) );
    }
    else
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{\"item1\":1, }", 12 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{\"item1\":1 , }", 13 ) );
    }

    // Test invalid dictionaries
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ \"item1\":1, \"item2\":2,, \"item3\":3 }", 23 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ ,\"item1\":1, \"item2\":2, \"item3\":3 }", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ BareWord }", IsJson5 ? 11 : 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ \"string\" }", 11 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ 'string' }", IsJson5 ? 11 : 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ 123 }", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ [1,2,3] }", 2 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ \"item1\":1, true }", IsJson5 ? 18 :13 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ \"item1\":1, \"string\", \"item2\":2 }", 21 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ 'key\" : 'value' }", IsJson5 ? 11 : 2 ) );

    if( IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ bare space: \"value\" }", 7 ) );
    }
    else
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ 'key' : \"value\" }", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ \"key\" : 'value' }", 10 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "{ 'key' : 'value' }", 2 ) );
    }

    return TestReturn;
}